

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts3HashElem * sqlite3Fts3HashFindElem(Fts3Hash *pH,void *pKey,int nKey)

{
  uint uVar1;
  _func_int_void_ptr_int *p_Var2;
  _func_int_void_ptr_int *xHash;
  int h;
  int nKey_local;
  void *pKey_local;
  Fts3Hash *pH_local;
  
  if ((pH == (Fts3Hash *)0x0) || (pH->ht == (_fts3ht *)0x0)) {
    pH_local = (Fts3Hash *)0x0;
  }
  else {
    p_Var2 = ftsHashFunction((int)pH->keyClass);
    uVar1 = (*p_Var2)(pKey,nKey);
    pH_local = (Fts3Hash *)fts3FindElementByHash(pH,pKey,nKey,uVar1 & pH->htsize - 1U);
  }
  return (Fts3HashElem *)pH_local;
}

Assistant:

SQLITE_PRIVATE Fts3HashElem *sqlite3Fts3HashFindElem(
  const Fts3Hash *pH, 
  const void *pKey, 
  int nKey
){
  int h;                          /* A hash on key */
  int (*xHash)(const void*,int);  /* The hash function */

  if( pH==0 || pH->ht==0 ) return 0;
  xHash = ftsHashFunction(pH->keyClass);
  assert( xHash!=0 );
  h = (*xHash)(pKey,nKey);
  assert( (pH->htsize & (pH->htsize-1))==0 );
  return fts3FindElementByHash(pH,pKey,nKey, h & (pH->htsize-1));
}